

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O0

void __thiscall cppcms::forwarder::forwarder(forwarder *this)

{
  long in_RDI;
  
  std::
  map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::map((map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
         *)0x42b9c0);
  booster::shared_mutex::shared_mutex((shared_mutex *)(in_RDI + 0x30));
  booster::hold_ptr<cppcms::forwarder::_data>::hold_ptr
            ((hold_ptr<cppcms::forwarder::_data> *)(in_RDI + 0x38));
  return;
}

Assistant:

forwarder::forwarder()
	{
	}